

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::clear(raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this)

{
  long *plVar1;
  long *plVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  
  if (this->size_ != 0) {
    if (this->capacity_ < 0x80) {
      if (this->capacity_ != 0) {
        sVar3 = this->capacity_;
        if (sVar3 != 0) {
          lVar4 = 0x10;
          sVar5 = 0;
          do {
            if (-1 < this->ctrl_[sVar5]) {
              plVar1 = *(long **)((long)this->slots_ + lVar4 + -0x10);
              plVar2 = (long *)((long)&(this->slots_->_M_dataplus)._M_p + lVar4);
              if (plVar2 != plVar1) {
                operator_delete(plVar1,*plVar2 + 1);
              }
            }
            sVar5 = sVar5 + 1;
            sVar3 = this->capacity_;
            lVar4 = lVar4 + 0x20;
          } while (sVar5 != sVar3);
        }
        this->size_ = 0;
        memset(this->ctrl_,0x80,sVar3 + 0x10);
        this->ctrl_[sVar3] = -1;
        reset_growth_left(this,this->capacity_);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x5a2,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::basic_string<char>>>::clear() [Policy = phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::basic_string<char>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const
			{
				return !size();
			}